

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oss.cpp
# Opt level: O1

bool __thiscall anon_unknown.dwarf_273a44::OSSPlayback::reset(OSSPlayback *this)

{
  ALCdevice **ppAVar1;
  uint uVar2;
  ALuint AVar3;
  ALCdevice *pAVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  char *this_00;
  uint uVar12;
  int ossFormat;
  ALuint numChannels;
  ALuint ossSpeed;
  audio_buf_info info;
  ALuint numFragmentsLogSize;
  int local_54;
  uint local_50;
  ALuint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_34;
  
  local_54 = 0;
  ppAVar1 = &(this->super_BackendBase).mDevice;
  pAVar4 = (this->super_BackendBase).mDevice;
  switch(pAVar4->FmtType) {
  case DevFmtByte:
    local_54 = 0x40;
    break;
  case DevFmtUByte:
    local_54 = 8;
    break;
  case DevFmtUShort:
  case DevFmtInt:
  case DevFmtUInt:
  case DevFmtFloat:
    pAVar4->FmtType = DevFmtShort;
  case DevFmtShort:
    local_54 = 0x10;
  }
  uVar11 = pAVar4->BufferSize;
  uVar2 = pAVar4->UpdateSize;
  uVar12 = 0;
  uVar6 = ChannelsFromDevFmt(pAVar4->FmtChans,pAVar4->mAmbiOrder);
  local_4c = (*ppAVar1)->Frequency;
  local_50 = uVar6;
  uVar7 = BytesFromDevFmt((*ppAVar1)->FmtType);
  uVar8 = (*ppAVar1)->UpdateSize * uVar7 * uVar6;
  if (1 < uVar8) {
    uVar12 = 0;
    do {
      uVar12 = uVar12 + 1;
      bVar5 = 3 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar5);
  }
  local_34 = 4;
  if (4 < uVar12) {
    local_34 = uVar12;
  }
  local_34 = uVar11 / uVar2 << 0x10 | local_34;
  local_48 = 0;
  uStack_40 = 0;
  ioctl(this->mFd,0xc004500a);
  iVar9 = ioctl(this->mFd,0xc0045005,&local_54);
  if (iVar9 < 0) {
    this_00 = "ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat)";
  }
  else {
    iVar9 = ioctl(this->mFd,0xc0045006,&local_50);
    if (iVar9 < 0) {
      this_00 = "ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels)";
    }
    else {
      iVar9 = ioctl(this->mFd,0xc0045002,&local_4c);
      if (iVar9 < 0) {
        this_00 = "ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed)";
      }
      else {
        iVar9 = ioctl(this->mFd,0x8010500c,&local_48);
        if (-1 < iVar9) {
          uVar10 = ChannelsFromDevFmt((*ppAVar1)->FmtChans,(*ppAVar1)->mAmbiOrder);
          if (uVar10 != local_50) {
            if ((int)gLogLevel < 1) {
              return false;
            }
            _GLOBAL__N_1::OSSPlayback::reset();
            return false;
          }
          if (local_54 == 8) {
            if ((*ppAVar1)->FmtType == DevFmtUByte) goto LAB_00165447;
          }
          else if (local_54 == 0x10) {
            if ((*ppAVar1)->FmtType == DevFmtShort) goto LAB_00165447;
          }
          else if ((local_54 == 0x40) && ((*ppAVar1)->FmtType == DevFmtByte)) {
LAB_00165447:
            pAVar4 = (this->super_BackendBase).mDevice;
            pAVar4->Frequency = local_4c;
            uVar11 = (uint)uStack_40 / (uVar7 * uVar6);
            pAVar4->UpdateSize = uVar11;
            pAVar4->BufferSize = uVar11 * (int)local_48;
            BackendBase::setDefaultChannelOrder(&this->super_BackendBase);
            pAVar4 = (this->super_BackendBase).mDevice;
            AVar3 = pAVar4->UpdateSize;
            uVar6 = BytesFromDevFmt(pAVar4->FmtType);
            uVar7 = ChannelsFromDevFmt(pAVar4->FmtChans,pAVar4->mAmbiOrder);
            std::vector<unsigned_char,_al::allocator<unsigned_char,_1UL>_>::resize
                      (&this->mMixData,(ulong)(uVar6 * AVar3 * uVar7));
            return true;
          }
          if ((int)gLogLevel < 1) {
            return false;
          }
          _GLOBAL__N_1::OSSPlayback::reset();
          return false;
        }
        this_00 = "ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info)";
      }
    }
  }
  if (0 < (int)gLogLevel) {
    _GLOBAL__N_1::OSSPlayback::reset((OSSPlayback *)this_00);
  }
  return false;
}

Assistant:

bool OSSPlayback::reset()
{
    int ossFormat{};
    switch(mDevice->FmtType)
    {
        case DevFmtByte:
            ossFormat = AFMT_S8;
            break;
        case DevFmtUByte:
            ossFormat = AFMT_U8;
            break;
        case DevFmtUShort:
        case DevFmtInt:
        case DevFmtUInt:
        case DevFmtFloat:
            mDevice->FmtType = DevFmtShort;
            /* fall-through */
        case DevFmtShort:
            ossFormat = AFMT_S16_NE;
            break;
    }

    ALuint periods{mDevice->BufferSize / mDevice->UpdateSize};
    ALuint numChannels{mDevice->channelsFromFmt()};
    ALuint ossSpeed{mDevice->Frequency};
    ALuint frameSize{numChannels * mDevice->bytesFromFmt()};
    /* According to the OSS spec, 16 bytes (log2(16)) is the minimum. */
    ALuint log2FragmentSize{maxu(log2i(mDevice->UpdateSize*frameSize), 4)};
    ALuint numFragmentsLogSize{(periods << 16) | log2FragmentSize};

    audio_buf_info info{};
    const char *err;
#define CHECKERR(func) if((func) < 0) {                                       \
    err = #func;                                                              \
    goto err;                                                                 \
}
    /* Don't fail if SETFRAGMENT fails. We can handle just about anything
     * that's reported back via GETOSPACE */
    ioctl(mFd, SNDCTL_DSP_SETFRAGMENT, &numFragmentsLogSize);
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SETFMT, &ossFormat));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_CHANNELS, &numChannels));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_SPEED, &ossSpeed));
    CHECKERR(ioctl(mFd, SNDCTL_DSP_GETOSPACE, &info));
    if(0)
    {
    err:
        ERR("%s failed: %s\n", err, strerror(errno));
        return false;
    }
#undef CHECKERR

    if(mDevice->channelsFromFmt() != numChannels)
    {
        ERR("Failed to set %s, got %d channels instead\n", DevFmtChannelsString(mDevice->FmtChans),
            numChannels);
        return false;
    }

    if(!((ossFormat == AFMT_S8 && mDevice->FmtType == DevFmtByte) ||
         (ossFormat == AFMT_U8 && mDevice->FmtType == DevFmtUByte) ||
         (ossFormat == AFMT_S16_NE && mDevice->FmtType == DevFmtShort)))
    {
        ERR("Failed to set %s samples, got OSS format %#x\n", DevFmtTypeString(mDevice->FmtType),
            ossFormat);
        return false;
    }

    mDevice->Frequency = ossSpeed;
    mDevice->UpdateSize = static_cast<ALuint>(info.fragsize) / frameSize;
    mDevice->BufferSize = static_cast<ALuint>(info.fragments) * mDevice->UpdateSize;

    setDefaultChannelOrder();

    mMixData.resize(mDevice->UpdateSize * mDevice->frameSizeFromFmt());

    return true;
}